

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

xmlSaveCtxtPtr xmlSaveToBuffer(xmlBufferPtr buffer,char *encoding,int options)

{
  xmlSaveCtxtPtr ctxt;
  xmlOutputBufferPtr pxVar1;
  
  ctxt = xmlNewSaveCtxt(encoding,options);
  if (ctxt != (xmlSaveCtxtPtr)0x0) {
    pxVar1 = xmlOutputBufferCreateBuffer(buffer,ctxt->handler);
    ctxt->buf = pxVar1;
    if (pxVar1 != (xmlOutputBufferPtr)0x0) {
      return ctxt;
    }
    xmlFreeSaveCtxt(ctxt);
  }
  return (xmlSaveCtxtPtr)0x0;
}

Assistant:

xmlSaveCtxtPtr
xmlSaveToBuffer(xmlBufferPtr buffer, const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;

    ret = xmlNewSaveCtxt(encoding, options);
    if (ret == NULL) return(NULL);
    ret->buf = xmlOutputBufferCreateBuffer(buffer, ret->handler);
    if (ret->buf == NULL) {
	xmlFreeSaveCtxt(ret);
	return(NULL);
    }
    return(ret);
}